

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * escapeForShellOldStyle(string *__return_storage_ptr__,string *str)

{
  char *local_28;
  char *ch;
  string *str_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = (char *)std::__cxx11::string::c_str(); *local_28 != '\0'; local_28 = local_28 + 1)
  {
    if (*local_28 == ' ') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeForShellOldStyle(const std::string& str)
{
  std::string result;
#if defined(_WIN32) && !defined(__CYGWIN__)
  // if there are spaces
  std::string temp = str;
  if (temp.find(" ") != std::string::npos &&
      temp.find("\"") == std::string::npos) {
    result = "\"";
    result += str;
    result += "\"";
    return result;
  }
  return str;
#else
  for (const char* ch = str.c_str(); *ch != '\0'; ++ch) {
    if (*ch == ' ') {
      result += '\\';
    }
    result += *ch;
  }
  return result;
#endif
}